

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O3

int enet_initialize_with_callbacks(ENetVersion version,ENetCallbacks *inits)

{
  _func_void_void_ptr *p_Var1;
  _func_void_ENetPacket_ptr *p_Var2;
  _func_void_ptr_size_t *p_Var3;
  _func_void_void_ptr *p_Var4;
  
  if (0x102ff < version) {
    p_Var1 = inits->free;
    if (inits->malloc == (_func_void_ptr_size_t *)0x0) {
      p_Var3 = callbacks.malloc;
      p_Var4 = callbacks.free;
      if (p_Var1 != (_func_void_void_ptr *)0x0) {
        return -1;
      }
    }
    else {
      p_Var3 = inits->malloc;
      p_Var4 = p_Var1;
      if (p_Var1 == (_func_void_void_ptr *)0x0) {
        return -1;
      }
    }
    callbacks.free = p_Var4;
    callbacks.malloc = p_Var3;
    if (inits->no_memory != (_func_void *)0x0) {
      callbacks.no_memory = inits->no_memory;
    }
    p_Var2 = inits->packet_destroy;
    if (inits->packet_create == (_func_ENetPacket_ptr_void_ptr_size_t_enet_uint32 *)0x0) {
      return -(uint)(p_Var2 != (_func_void_ENetPacket_ptr *)0x0);
    }
    if (p_Var2 != (_func_void_ENetPacket_ptr *)0x0) {
      callbacks.packet_create = inits->packet_create;
      callbacks.packet_destroy = p_Var2;
      return 0;
    }
  }
  return -1;
}

Assistant:

int enet_initialize_with_callbacks(ENetVersion version, const ENetCallbacks *inits) {
        if (version < ENET_VERSION_CREATE(1, 3, 0)) {
            return -1;
        }

        if (inits->malloc != NULL || inits->free != NULL) {
            if (inits->malloc == NULL || inits->free == NULL) {
                return -1;
            }

            callbacks.malloc = inits->malloc;
            callbacks.free   = inits->free;
        }

        if (inits->no_memory != NULL) {
            callbacks.no_memory = inits->no_memory;
        }

        if (inits->packet_create != NULL || inits->packet_destroy != NULL) {
            if (inits->packet_create == NULL || inits->packet_destroy == NULL) {
                return -1;
            }

            callbacks.packet_create = inits->packet_create;
            callbacks.packet_destroy = inits->packet_destroy;
        }

        return enet_initialize();
    }